

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O2

void __thiscall
Js::ArrayBufferContentForDelayedFreeBase::Release(ArrayBufferContentForDelayedFreeBase *this)

{
  RefCountedBuffer *this_00;
  long lVar1;
  
  this_00 = this->buffer;
  this->buffer = (RefCountedBuffer *)0x0;
  lVar1 = RefCountedBuffer::Release(this_00);
  if (lVar1 != 0) {
    return;
  }
  (*this->_vptr_ArrayBufferContentForDelayedFreeBase[8])(this,this_00->buffer);
  Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::RefCountedBuffer>
            (&Memory::HeapAllocator::Instance,this_00);
  return;
}

Assistant:

void ArrayBufferContentForDelayedFreeBase::Release()
    {
        // this function will be called when we are releasing instance from the listOfBuffer which we have delayed.

        RefCountedBuffer *content = this->buffer;
        this->buffer = nullptr;
        long refCount = content->Release();
        if (refCount == 0)
        {
            FreeTheBuffer(content->GetBuffer());
            HeapDelete(content);
        }
    }